

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall File::writeULong(File *this,unsigned_long value)

{
  uchar *__ptr;
  size_t sVar1;
  size_t sVar2;
  unsigned_long in_RDI;
  ByteString toWrite;
  ByteString *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    local_1 = false;
  }
  else {
    ByteString::ByteString
              ((ByteString *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
    __ptr = ByteString::const_byte_str(in_stack_ffffffffffffff78);
    sVar1 = ByteString::size((ByteString *)0x1d17fd);
    sVar2 = fwrite(__ptr,1,sVar1,*(FILE **)(in_RDI + 0x30));
    sVar1 = ByteString::size((ByteString *)0x1d1832);
    local_1 = sVar2 == sVar1;
    ByteString::~ByteString((ByteString *)0x1d188e);
  }
  return local_1;
}

Assistant:

bool File::writeULong(const unsigned long value)
{
	if (!valid) return false;

	ByteString toWrite(value);

	// Write the value to the file
	if (fwrite(toWrite.const_byte_str(), 1, toWrite.size(), stream) != toWrite.size())
	{
		return false;
	}

	return true;
}